

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pySRUP_Data.cpp
# Opt level: O0

object get_int16_data(SRUP_MSG_DATA *self)

{
  int16_t *x;
  SRUP_MSG_DATA *in_RSI;
  int16_t *rv;
  SRUP_MSG_DATA *self_local;
  
  x = SRUP_MSG_DATA::data_int16(in_RSI);
  if (x == (int16_t *)0x0) {
    boost::python::api::object::object((object *)self);
  }
  else {
    boost::python::api::object::object<short>((object *)self,x);
  }
  return (object)(object_base)self;
}

Assistant:

boost::python::object get_int16_data(SRUP_MSG_DATA& self)
{
    int16_t* rv;
    rv = self.data_int16();

    if (rv != nullptr)
        return boost::python::object(*rv);
    else
        return boost::python::object();

}